

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

void __thiscall mocker::ir::Builder::operator()(Builder *this,ClassDecl *node)

{
  pointer psVar1;
  pointer psVar2;
  shared_ptr<mocker::ast::FuncDecl> sVar3;
  shared_ptr<mocker::ast::FuncDecl> p;
  shared_ptr<mocker::ast::Declaration> local_38;
  
  psVar1 = (node->members).
           super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar2 = (node->members).
                super__Vector_base<std::shared_ptr<mocker::ast::Declaration>,_std::allocator<std::shared_ptr<mocker::ast::Declaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    sVar3 = std::dynamic_pointer_cast<mocker::ast::FuncDecl,mocker::ast::Declaration>(&local_38);
    if (local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (*((local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_ASTNode)._vptr_ASTNode[3])
                (local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&this->field_0x0 + *(long *)(*(long *)this + -0xf0),
                 sVar3.super___shared_ptr<mocker::ast::FuncDecl,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  return;
}

Assistant:

void Builder::operator()(const ast::ClassDecl &node) const {
  for (auto &member : node.members)
    if (auto p = std::dynamic_pointer_cast<ast::FuncDecl>(member))
      visit(*p);
}